

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

bool __thiscall wasm::ModuleReader::isBinaryFile(ModuleReader *this,string *filename)

{
  bool bVar1;
  string local_238 [8];
  ifstream infile;
  undefined1 local_30 [8];
  char buffer [4];
  
  std::ifstream::ifstream(local_238);
  Path::to_path((PathString *)local_30,filename);
  std::ifstream::open(local_238,(_Ios_Openmode)local_30);
  std::__cxx11::string::~string((string *)local_30);
  local_30._0_4_ = 0x4030201;
  std::istream::read((char *)local_238,(long)local_30);
  std::ifstream::close();
  bVar1 = false;
  if (((local_30[0] == (string)0x0) && (bVar1 = false, local_30[1] == 'a')) && (local_30[2] == 's'))
  {
    bVar1 = local_30[3] == 'm';
  }
  std::ifstream::~ifstream(local_238);
  return bVar1;
}

Assistant:

bool ModuleReader::isBinaryFile(std::string filename) {
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in | std::ifstream::binary;
  infile.open(wasm::Path::to_path(filename), flags);
  char buffer[4] = {1, 2, 3, 4};
  infile.read(buffer, 4);
  infile.close();
  return buffer[0] == '\0' && buffer[1] == 'a' && buffer[2] == 's' &&
         buffer[3] == 'm';
}